

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsaa.c
# Opt level: O1

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  if (key == 0x20 && action == 1) {
    glfwSetTime(0.0);
    return;
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_SPACE:
            glfwSetTime(0.0);
            break;
    }
}